

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O3

int __thiscall QDialog::open(QDialog *this,char *__file,int __oflag,...)

{
  long lVar1;
  bool bVar2;
  WindowModality WVar3;
  int extraout_EAX;
  
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  WVar3 = QWidget::windowModality(&this->super_QWidget);
  if (WVar3 != WindowModal) {
    *(WindowModality *)(lVar1 + 0x2b0) = WVar3;
    bVar2 = QWidget::testAttribute_helper(&this->super_QWidget,WA_SetWindowModality);
    *(bool *)(lVar1 + 0x2b4) = bVar2;
    QWidget::setWindowModality(&this->super_QWidget,WindowModal);
    QWidget::setAttribute(&this->super_QWidget,WA_SetWindowModality,false);
  }
  *(undefined4 *)(*(long *)&(this->super_QWidget).field_0x8 + 0x2ac) = 0;
  QWidget::show(&this->super_QWidget);
  return extraout_EAX;
}

Assistant:

void QDialog::open()
{
    Q_D(QDialog);

    Qt::WindowModality modality = windowModality();
    if (modality != Qt::WindowModal) {
        d->resetModalityTo = modality;
        d->wasModalitySet = testAttribute(Qt::WA_SetWindowModality);
        setWindowModality(Qt::WindowModal);
        setAttribute(Qt::WA_SetWindowModality, false);
#ifdef Q_OS_MAC
        setParent(parentWidget(), Qt::Sheet);
#endif
    }

    setResult(0);
    show();
}